

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *
vkt::anon_unknown_6::createDebugReportRecorder
          (MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
           *__return_storage_ptr__,PlatformInterface *vkp,InstanceInterface *vki,VkInstance instance
          )

{
  bool bVar1;
  DebugReportRecorder *this;
  NotSupportedError *this_00;
  DefaultDeleter<vk::DebugReportRecorder> local_35 [13];
  VkInstance local_28;
  VkInstance instance_local;
  InstanceInterface *vki_local;
  PlatformInterface *vkp_local;
  
  local_28 = instance;
  instance_local = (VkInstance)vki;
  vki_local = (InstanceInterface *)vkp;
  vkp_local = (PlatformInterface *)__return_storage_ptr__;
  bVar1 = ::vk::isDebugReportSupported(vkp);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"VK_EXT_debug_report is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktTestPackage.cpp"
               ,0x9e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  this = (DebugReportRecorder *)operator_new(0x40);
  ::vk::DebugReportRecorder::DebugReportRecorder(this,(InstanceInterface *)instance_local,local_28);
  de::DefaultDeleter<vk::DebugReportRecorder>::DefaultDeleter(local_35);
  de::details::MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
  MovePtr(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<vk::DebugReportRecorder> createDebugReportRecorder (const vk::PlatformInterface& vkp, const vk::InstanceInterface& vki, vk::VkInstance instance)
{
	if (isDebugReportSupported(vkp))
		return MovePtr<vk::DebugReportRecorder>(new vk::DebugReportRecorder(vki, instance));
	else
		TCU_THROW(NotSupportedError, "VK_EXT_debug_report is not supported");
}